

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

void MeCab::anon_unknown_0::anon_unknown_3::writeLattice(Lattice *lattice,StringBuffer *os)

{
  long lVar1;
  size_t in_RCX;
  StringBuffer *in_RSI;
  long *in_RDI;
  Node *node;
  char *n;
  
  lVar1 = (**(code **)(*in_RDI + 0x10))();
  for (n = *(char **)(lVar1 + 8); *(long *)(n + 8) != 0; n = *(char **)(n + 8)) {
    StringBuffer::write(in_RSI,(int)*(undefined8 *)(n + 0x30),(void *)(ulong)*(ushort *)(n + 0x44),
                        in_RCX);
    StringBuffer::operator<<(in_RSI,(char)((ulong)n >> 0x38));
    StringBuffer::operator<<(in_RSI,n);
    StringBuffer::operator<<(in_RSI,(char)((ulong)n >> 0x38));
  }
  StringBuffer::operator<<(in_RSI,n);
  return;
}

Assistant:

void writeLattice(Lattice *lattice, StringBuffer *os) {
  for (const Node *node = lattice->bos_node()->next;
       node->next; node = node->next) {
    os->write(node->surface, node->length);
    *os << '\t' << node->feature;
    *os << '\n';
  }
  *os << "EOS\n";
}